

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markable.hpp
# Opt level: O0

void __thiscall
ak_toolkit::markable_ns::dual_storage<mark_range2>::operator=
          (dual_storage<mark_range2> *this,dual_storage<mark_range2> *rhs)

{
  bool bVar1;
  range2_members *prVar2;
  range2_members *prVar3;
  value_type *v;
  dual_storage<mark_range2> *rhs_local;
  dual_storage<mark_range2> *this_local;
  
  bVar1 = has_value(this);
  if ((bVar1) && (bVar1 = has_value(rhs), bVar1)) {
    prVar2 = &as_value(rhs)->super_range2_members;
    prVar3 = &as_value(this)->super_range2_members;
    *prVar3 = *prVar2;
  }
  else {
    bVar1 = has_value(this);
    if ((!bVar1) || (bVar1 = has_value(rhs), bVar1)) {
      bVar1 = has_value(this);
      if ((!bVar1) && (bVar1 = has_value(rhs), bVar1)) {
        v = as_value(rhs);
        change_to_value(this,v);
      }
    }
    else {
      clear_value(this);
    }
  }
  return;
}

Assistant:

void operator=(const dual_storage& rhs)
    {
      if (has_value() && rhs.has_value())
      {
        as_value() = rhs.as_value();
      }
      else if (has_value() && !rhs.has_value())
      {
        clear_value();
      }
      else if (!has_value() && rhs.has_value())
      {
        change_to_value(rhs.as_value());
      }
    }